

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O0

void __thiscall
glcts::ViewportArray::DrawTestBase::prepareTextureArrayR32I(DrawTestBase *this,texture *texture)

{
  pointer this_00;
  reference pvVar1;
  uint local_40;
  GLuint i;
  undefined1 local_30 [8];
  vector<int,_std::allocator<int>_> data;
  texture *texture_local;
  DrawTestBase *this_local;
  
  data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)texture;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_30);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)local_30,0x40000);
  for (local_40 = 0; local_40 < 0x40000; local_40 = local_40 + 1) {
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_30,(ulong)local_40);
    *pvVar1 = -1;
  }
  Utils::texture::create
            ((texture *)
             data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage,0x80,0x80,0x10,0x8235);
  this_00 = data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage;
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_30,0);
  Utils::texture::update((texture *)this_00,0x80,0x80,0x10,0x8d94,0x1404,pvVar1);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_30);
  return;
}

Assistant:

void DrawTestBase::prepareTextureArrayR32I(Utils::texture& texture)
{
	static const GLuint size = m_width * m_height * m_depth;

	std::vector<GLint> data;
	data.resize(size);

	for (GLuint i = 0; i < size; ++i)
	{
		data[i] = -1;
	}

	texture.create(m_width, m_height, m_depth, GL_R32I);
	texture.update(m_width, m_height, m_depth, GL_RED_INTEGER, GL_INT, &data[0]);
}